

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

void Abc_NodeConstantInput(Abc_Obj_t *pNode,Abc_Obj_t *pFanin,int fConst0)

{
  DdManager *dd_00;
  DdNode *f;
  int iVar1;
  char *pcVar2;
  DdNode *pDVar3;
  int iFanin;
  DdNode *bTemp;
  DdNode *bVar;
  DdManager *dd;
  int fConst0_local;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pNode_local;
  
  dd_00 = (DdManager *)pNode->pNtk->pManFunc;
  iVar1 = Abc_NtkIsBddLogic(pNode->pNtk);
  if (iVar1 != 0) {
    iVar1 = Vec_IntFind(&pNode->vFanins,pFanin->Id);
    if (iVar1 == -1) {
      pcVar2 = Abc_ObjName(pFanin);
      printf("Node %s should be among",pcVar2);
      pcVar2 = Abc_ObjName(pNode);
      printf(" the fanins of node %s...\n",pcVar2);
    }
    else {
      pDVar3 = Cudd_bddIthVar(dd_00,iVar1);
      f = (DdNode *)(pNode->field_5).pData;
      pDVar3 = Cudd_Cofactor(dd_00,f,(DdNode *)((ulong)pDVar3 ^ (long)fConst0));
      (pNode->field_5).pData = pDVar3;
      Cudd_Ref((DdNode *)(pNode->field_5).pData);
      Cudd_RecursiveDeref(dd_00,f);
    }
    return;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                ,0x247,"void Abc_NodeConstantInput(Abc_Obj_t *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_NodeConstantInput( Abc_Obj_t * pNode, Abc_Obj_t * pFanin, int fConst0 )
{
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bVar, * bTemp;
    int iFanin;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) ); 
    if ( (iFanin = Vec_IntFind( &pNode->vFanins, pFanin->Id )) == -1 )
    {
        printf( "Node %s should be among", Abc_ObjName(pFanin) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNode) );
        return;
    }
    bVar = Cudd_NotCond( Cudd_bddIthVar(dd, iFanin), fConst0 );
    pNode->pData = Cudd_Cofactor( dd, bTemp = (DdNode *)pNode->pData, bVar );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( dd, bTemp );
}